

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int build_dd(DdManager *table,int num,int lower,int upper)

{
  int iVar1;
  int size;
  int limit;
  int index;
  int position;
  int j;
  int i;
  int upper_local;
  int lower_local;
  int num_local;
  DdManager *table_local;
  
  j = upper;
  i = lower;
  upper_local = num;
  _lower_local = table;
  if ((computed == (st__table *)0x0) ||
     (iVar1 = st__lookup_int(computed,(char *)(storedd + num * (numvars + 1)),&size), iVar1 == 0)) {
    iVar1 = storedd[numvars];
    for (index = 0; index < numvars; index = index + 1) {
      position = storedd[upper_local * (numvars + 1) + index];
      limit = _lower_local->perm[position];
      result = sift_up(_lower_local,limit,index + i);
      if (result == 0) {
        result = 0;
        return 0;
      }
      if (iVar1 * 0x14 < (int)(_lower_local->keys - _lower_local->isolated)) break;
    }
    result = cuddSifting(_lower_local,i,j);
    if (result == 0) {
      table_local._4_4_ = 0;
    }
    else {
      for (index = 0; index < numvars; index = index + 1) {
        storedd[upper_local * (numvars + 1) + index] = _lower_local->invperm[i + index];
      }
      storedd[upper_local * (numvars + 1) + numvars] = _lower_local->keys - _lower_local->isolated;
      table_local._4_4_ = 1;
    }
  }
  else {
    storedd[upper_local * (numvars + 1) + numvars] = storedd[size * (numvars + 1) + numvars];
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

static int
build_dd(
  DdManager * table,
  int  num /* the index of the individual to be built */,
  int  lower,
  int  upper)
{
    int         i,j;            /* loop vars */
    int         position;
    int         index;
    int         limit;          /* how large the DD for this order can grow */
    int         size;

    /* Check the computed table. If the order already exists, it
    ** suffices to copy the size from the existing entry.
    */
    if (computed && st__lookup_int(computed,(char *)&STOREDD(num,0),&index)) {
        STOREDD(num,numvars) = STOREDD(index,numvars);
#ifdef DD_STATS
        (void) fprintf(table->out,"\nCache hit for index %d", index);
#endif
        return(1);
    }

    /* Stop if the DD grows 20 times larges than the reference size. */
    limit = 20 * STOREDD(0,numvars);

    /* Sift up the variables so as to build the desired permutation.
    ** First the variable that has to be on top is sifted to the top.
    ** Then the variable that has to occupy the secon position is sifted
    ** up to the second position, and so on.
    */
    for (j = 0; j < numvars; j++) {
        i = STOREDD(num,j);
        position = table->perm[i];
        result = sift_up(table,position,j+lower);
        if (!result) return(0);
        size = table->keys - table->isolated;
        if (size > limit) break;
    }

    /* Sift the DD just built. */
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    result = cuddSifting(table,lower,upper);
    if (!result) return(0);

    /* Copy order and size to table. */
    for (j = 0; j < numvars; j++) {
        STOREDD(num,j) = table->invperm[lower+j];
    }
    STOREDD(num,numvars) = table->keys - table->isolated; /* size of new DD */
    return(1);

}